

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::comptype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  MaybeResult *pMVar1;
  undefined8 uVar2;
  bool bVar3;
  Signature *type_00;
  Continuation *type_01;
  pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct> *type_02;
  Array *type_03;
  Lexer *this;
  allocator<char> local_289;
  string local_288;
  Err local_268;
  Ok local_241;
  Err local_240;
  Err *local_220;
  Err *err_3;
  MaybeResult<wasm::Array> _val_3;
  MaybeResult<wasm::Array> type_3;
  Err local_1c0;
  Err *local_1a0;
  Err *err_2;
  MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_> _val_2
  ;
  MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_> type_2
  ;
  Err local_120;
  Err *local_100;
  Err *err_1;
  MaybeResult<wasm::Continuation> _val_1;
  MaybeResult<wasm::Continuation> type_1;
  Err local_a0;
  Err *local_80;
  Err *err;
  MaybeResult<wasm::Signature> _val;
  undefined1 local_40 [8];
  MaybeResult<wasm::Signature> type;
  ParseTypeDefsCtx *ctx_local;
  
  type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_ = ctx;
  functype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Signature> *)local_40,ctx);
  bVar3 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_40);
  if (bVar3) {
    MaybeResult<wasm::Signature>::MaybeResult
              ((MaybeResult<wasm::Signature> *)&err,(MaybeResult<wasm::Signature> *)local_40);
    local_80 = MaybeResult<wasm::Signature>::getErr((MaybeResult<wasm::Signature> *)&err);
    type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_1_ =
         local_80 != (Err *)0x0;
    if ((bool)type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_1_) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._37_3_ = 0;
    MaybeResult<wasm::Signature>::~MaybeResult((MaybeResult<wasm::Signature> *)&err);
    uVar2 = type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_;
    if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
      type_00 = MaybeResult<wasm::Signature>::operator*((MaybeResult<wasm::Signature> *)local_40);
      ParseTypeDefsCtx::addFuncType((ParseTypeDefsCtx *)uVar2,type_00);
      Result<wasm::Ok>::Result<wasm::Ok>
                (__return_storage_ptr__,
                 (Ok *)((long)&type_1.val.
                               super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err> +
                       0x23));
      type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 1;
    }
  }
  else {
    type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 0;
  }
  MaybeResult<wasm::Signature>::~MaybeResult((MaybeResult<wasm::Signature> *)local_40);
  if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
    pMVar1 = (MaybeResult *)
             ((long)&_val_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20);
    conttype<wasm::WATParser::ParseTypeDefsCtx>
              ((MaybeResult<wasm::Continuation> *)pMVar1,
               (ParseTypeDefsCtx *)
               type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_);
    bVar3 = wasm::MaybeResult::operator_cast_to_bool(pMVar1);
    if (bVar3) {
      MaybeResult<wasm::Continuation>::MaybeResult
                ((MaybeResult<wasm::Continuation> *)&err_1,
                 (MaybeResult<wasm::Continuation> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20));
      local_100 = MaybeResult<wasm::Continuation>::getErr((MaybeResult<wasm::Continuation> *)&err_1)
      ;
      bVar3 = local_100 != (Err *)0x0;
      if (bVar3) {
        wasm::Err::Err(&local_120,local_100);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_120);
        wasm::Err::~Err(&local_120);
      }
      type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._37_3_ = 0;
      type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_1_ = bVar3;
      MaybeResult<wasm::Continuation>::~MaybeResult((MaybeResult<wasm::Continuation> *)&err_1);
      uVar2 = type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_;
      if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
        type_01 = MaybeResult<wasm::Continuation>::operator*
                            ((MaybeResult<wasm::Continuation> *)
                             ((long)&_val_1.val.
                                     super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>
                             + 0x20));
        ParseTypeDefsCtx::addContType((ParseTypeDefsCtx *)uVar2,type_01);
        Result<wasm::Ok>::Result<wasm::Ok>
                  (__return_storage_ptr__,
                   (Ok *)((long)&type_2.val.
                                 super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                         + 0x37));
        type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 1;
      }
    }
    else {
      type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 0;
    }
    MaybeResult<wasm::Continuation>::~MaybeResult
              ((MaybeResult<wasm::Continuation> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20));
    if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
      pMVar1 = (MaybeResult *)
               ((long)&_val_2.val.
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               + 0x30);
      structtype<wasm::WATParser::ParseTypeDefsCtx>
                ((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                  *)pMVar1,
                 (ParseTypeDefsCtx *)
                 type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_);
      bVar3 = wasm::MaybeResult::operator_cast_to_bool(pMVar1);
      if (bVar3) {
        MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
        ::MaybeResult((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                       *)&err_2,
                      (MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                       *)((long)&_val_2.val.
                                 super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                         + 0x30));
        local_1a0 = MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                    ::getErr((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                              *)&err_2);
        bVar3 = local_1a0 != (Err *)0x0;
        if (bVar3) {
          wasm::Err::Err(&local_1c0,local_1a0);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1c0);
          wasm::Err::~Err(&local_1c0);
        }
        type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._37_3_ = 0;
        type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_1_ = bVar3;
        MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
        ::~MaybeResult((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                        *)&err_2);
        uVar2 = type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_;
        if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
          type_02 = MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                    ::operator*((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                                 *)((long)&_val_2.val.
                                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                           .
                                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                   + 0x30));
          ParseTypeDefsCtx::addStructType((ParseTypeDefsCtx *)uVar2,type_02);
          Result<wasm::Ok>::Result<wasm::Ok>
                    (__return_storage_ptr__,
                     (Ok *)((long)&type_3.val.
                                   super__Variant_base<wasm::Array,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Array,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Array,_wasm::None,_wasm::Err> + 0x27
                           ));
          type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 1;
        }
      }
      else {
        type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 0;
      }
      MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>::
      ~MaybeResult((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                    *)((long)&_val_2.val.
                              super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                      + 0x30));
      if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
        pMVar1 = (MaybeResult *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Array,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Array,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Array,_wasm::None,_wasm::Err> + 0x20);
        arraytype<wasm::WATParser::ParseTypeDefsCtx>
                  ((MaybeResult<wasm::Array> *)pMVar1,
                   (ParseTypeDefsCtx *)
                   type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_);
        bVar3 = wasm::MaybeResult::operator_cast_to_bool(pMVar1);
        if (bVar3) {
          MaybeResult<wasm::Array>::MaybeResult
                    ((MaybeResult<wasm::Array> *)&err_3,
                     (MaybeResult<wasm::Array> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Array,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Array,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Array,_wasm::None,_wasm::Err> + 0x20));
          local_220 = MaybeResult<wasm::Array>::getErr((MaybeResult<wasm::Array> *)&err_3);
          bVar3 = local_220 != (Err *)0x0;
          if (bVar3) {
            wasm::Err::Err(&local_240,local_220);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_240);
            wasm::Err::~Err(&local_240);
          }
          type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._37_3_ = 0;
          type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_1_ = bVar3;
          MaybeResult<wasm::Array>::~MaybeResult((MaybeResult<wasm::Array> *)&err_3);
          uVar2 = type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._32_8_;
          if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
            type_03 = MaybeResult<wasm::Array>::operator*
                                ((MaybeResult<wasm::Array> *)
                                 ((long)&_val_3.val.
                                         super__Variant_base<wasm::Array,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Array,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::Array,_wasm::None,_wasm::Err>
                                         .super__Move_ctor_alias<wasm::Array,_wasm::None,_wasm::Err>
                                         .super__Copy_ctor_alias<wasm::Array,_wasm::None,_wasm::Err>
                                 + 0x20));
            ParseTypeDefsCtx::addArrayType((ParseTypeDefsCtx *)uVar2,type_03);
            Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_241);
            type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 1;
          }
        }
        else {
          type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ = 0;
        }
        MaybeResult<wasm::Array>::~MaybeResult
                  ((MaybeResult<wasm::Array> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Array,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Array,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Array,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Array,_wasm::None,_wasm::Err> + 0x20));
        if (type_1.val.super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err>._36_4_ == 0) {
          this = (Lexer *)(type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           _32_8_ + 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"expected type description",&local_289);
          Lexer::err(&local_268,this,&local_288);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_268);
          wasm::Err::~Err(&local_268);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> comptype(Ctx& ctx) {
  if (auto type = functype(ctx)) {
    CHECK_ERR(type);
    ctx.addFuncType(*type);
    return Ok{};
  }
  if (auto type = conttype(ctx)) {
    CHECK_ERR(type);
    ctx.addContType(*type);
    return Ok{};
  }
  if (auto type = structtype(ctx)) {
    CHECK_ERR(type);
    ctx.addStructType(*type);
    return Ok{};
  }
  if (auto type = arraytype(ctx)) {
    CHECK_ERR(type);
    ctx.addArrayType(*type);
    return Ok{};
  }
  return ctx.in.err("expected type description");
}